

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * kj::str<capnp::Text::Reader>(String *__return_storage_ptr__,Reader *params)

{
  Reader *value;
  ArrayPtr<const_char> local_28;
  Reader *local_18;
  Reader *params_local;
  
  local_18 = params;
  params_local = (Reader *)__return_storage_ptr__;
  value = fwd<capnp::Text::Reader>(params);
  local_28 = toCharSequence<capnp::Text::Reader>(value);
  _::concat<kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)local_28.size_);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}